

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdWritePrime(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  word pCofTemp [64];
  char pRes [2000];
  
  if (nVars < 3) {
    __assert_fail("nVars > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x414,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
  }
  if (p->fSplitPrime == 0) {
    iVar3 = 2;
    if (p->fWriteTruth != 0) {
      iVar1 = Abc_TtWriteHexRev(p->pOutput + p->nPos,pTruth,nVars);
      p->nPos = p->nPos + iVar1;
    }
  }
  else {
    iVar3 = 1 << ((char)nVars - 6U & 0x1f);
    if ((uint)nVars < 7) {
      iVar3 = 1;
    }
    iVar1 = Dau_DsdCheck1Step(p,pTruth,nVars,p->pVarLevels);
    if (iVar1 == -2) {
      iVar3 = Abc_TtWriteHexRev(p->pOutput + p->nPos,pTruth,nVars);
      p->nPos = p->nPos + iVar3;
      iVar3 = 2;
    }
    else {
      if (iVar1 == -1) {
        __assert_fail("vBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x41a,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      Dau_DsdWriteString(p,"<");
      Dau_DsdWriteVar(p,iVar1,0);
      Abc_TtCofactor1p(pCofTemp,pTruth,iVar3,iVar1);
      iVar2 = Dau_DsdDecompose(pCofTemp,nVars,0,p->fWriteTruth,pRes);
      if (iVar2 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x427,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      Dau_DsdWriteString(p,pRes);
      Abc_TtCofactor0p(pCofTemp,pTruth,iVar3,iVar1);
      iVar3 = Dau_DsdDecompose(pCofTemp,nVars,0,p->fWriteTruth,pRes);
      if (iVar3 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x42c,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      Dau_DsdWriteString(p,pRes);
      Dau_DsdWriteString(p,">");
      iVar3 = 1;
    }
  }
  Dau_DsdWriteString(p,"{");
  for (uVar4 = 0; (uint)nVars != uVar4; uVar4 = uVar4 + 1) {
    Dau_DsdWriteVar(p,pVars[uVar4],0);
  }
  Dau_DsdWriteString(p,"}");
  p->nSizeNonDec = nVars;
  return iVar3;
}

Assistant:

static inline int Dau_DsdWritePrime( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    int v, RetValue = 2;
    assert( nVars > 2 );
    if ( p->fSplitPrime )
    {
        word pCofTemp[DAU_MAX_WORD];
        int nWords = Abc_TtWordNum(nVars);
        int vBest = Dau_DsdCheck1Step( p, pTruth, nVars, p->pVarLevels );
        assert( vBest != -1 );
        if ( vBest == -2 ) // non-dec
            p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
        else 
        {
            char pRes[DAU_MAX_STR];
            int nNonDecSize;
            // compose the result
            Dau_DsdWriteString( p, "<" );
            Dau_DsdWriteVar( p, vBest, 0 );
            // split decomposition
            Abc_TtCofactor1p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            // split decomposition
            Abc_TtCofactor0p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            Dau_DsdWriteString( p, ">" );
            RetValue = 1;
        }
    }
    else if ( p->fWriteTruth )
        p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
    Dau_DsdWriteString( p, "{" );
    for ( v = 0; v < nVars; v++ )
        Dau_DsdWriteVar( p, pVars[v], 0 );
    Dau_DsdWriteString( p, "}" );
    p->nSizeNonDec = nVars;
    return RetValue;
}